

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_pic.cpp
# Opt level: O2

void __thiscall QPicturePaintEngine::updateRenderHints(QPicturePaintEngine *this,RenderHints hints)

{
  int *piVar1;
  QPaintEnginePrivate *pQVar2;
  int pos;
  long in_FS_OFFSET;
  QRectF local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (this->super_QPaintEngine).d_ptr.d;
  piVar1 = (int *)(*(long *)&pQVar2[1].systemRect + 0x18);
  *piVar1 = *piVar1 + 1;
  pQVar2 = pQVar2 + 1;
  QDataStream::operator<<((QDataStream *)pQVar2,0x3f);
  QDataStream::operator<<((QDataStream *)pQVar2,0);
  pos = QBuffer::pos();
  QDataStream::operator<<
            ((QDataStream *)pQVar2,
             (int)hints.super_QFlagsStorageHelper<QPainter::RenderHint,_4>.
                  super_QFlagsStorage<QPainter::RenderHint>.i);
  local_48.w = 0.0;
  local_48.h = 0.0;
  local_48.xp = 0.0;
  local_48.yp = 0.0;
  writeCmdLength(this,pos,&local_48,false);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPicturePaintEngine::updateRenderHints(QPainter::RenderHints hints)
{
    Q_D(QPicturePaintEngine);
#ifdef QT_PICTURE_DEBUG
    qDebug() << " -> updateRenderHints(): " << hints;
#endif
    int pos;
    SERIALIZE_CMD(QPicturePrivate::PdcSetRenderHint);
    d->s << (quint32) hints;
    writeCmdLength(pos, QRect(), false);
}